

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalSerialize
          (CodeGeneratorRequest *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  size_t __n;
  ulong uVar2;
  Type *s;
  undefined8 *puVar3;
  uint8_t *puVar4;
  Type *value;
  int iVar5;
  int iVar6;
  
  iVar6 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  iVar5 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
    iVar5 = 0;
  }
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    s = internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&(this->file_to_generate_).super_RepeatedPtrFieldBase,iVar5);
    internal::WireFormatLite::VerifyUtf8String
              ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = '\n';
      target[1] = (uint8_t)__n;
      memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
      target = target + __n + 2;
    }
    else {
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,target);
    }
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)((ulong)(this->parameter_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(string *)
                                 ((ulong)(this->parameter_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  if ((uVar1 & 2) != 0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::InternalWriteMessage<google::protobuf::compiler::Version>
                       (3,this->compiler_version_,puVar4,stream);
  }
  iVar6 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                      (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar5);
    target = internal::WireFormatLite::InternalWriteMessage<google::protobuf::FileDescriptorProto>
                       (0xf,value,puVar4,stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffc) + 8),target,stream);
  return puVar4;
}

Assistant:

uint8_t* CodeGeneratorRequest::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->_internal_file_to_generate_size(); i < n; i++) {
    const auto& s = this->_internal_file_to_generate(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = stream->WriteString(1, s, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_parameter().data(), static_cast<int>(this->_internal_parameter().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_parameter(), target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::compiler_version(this), target, stream);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_proto_file_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(15, this->_internal_proto_file(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}